

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O2

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::LookupAny
          (PersistentStorageJson *this,Network *aValue,
          vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
          *aRet)

{
  Status SVar1;
  string sStack_98;
  function<bool_(const_ot::commissioner::persistent_storage::Network_&)> local_78;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  local_58._8_8_ = 0;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_28 = std::
             _Function_handler<bool_(const_ot::commissioner::persistent_storage::Network_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json.cpp:471:49)>
             ::_M_manager;
  local_48 = std::
             _Function_handler<bool_(const_ot::commissioner::persistent_storage::Network_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json.cpp:473:12)>
             ::_M_manager;
  local_20 = std::
             _Function_handler<bool_(const_ot::commissioner::persistent_storage::Network_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json.cpp:471:49)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<bool_(const_ot::commissioner::persistent_storage::Network_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json.cpp:473:12)>
             ::_M_invoke;
  local_58._M_unused._M_object = aValue;
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  std::function<bool_(const_ot::commissioner::persistent_storage::Network_&)>::function
            (&local_78,
             (function<bool_(const_ot::commissioner::persistent_storage::Network_&)> *)&local_58);
  std::__cxx11::string::string((string *)&sStack_98,(string *)JSON_NWK_abi_cxx11_);
  SVar1 = LookupPred<ot::commissioner::persistent_storage::Network>(this,&local_78,aRet,&sStack_98);
  std::__cxx11::string::~string((string *)&sStack_98);
  std::_Function_base::~_Function_base(&local_78.super__Function_base);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  return SVar1;
}

Assistant:

PersistentStorage::Status PersistentStorageJson::LookupAny(Network const &aValue, std::vector<Network> &aRet)
{
    std::function<bool(Network const &)> pred = [](Network const &) { return true; };

    pred = [&aValue](Network const &el) {
        bool aRet = (aValue.mCcm < 0 || aValue.mCcm == el.mCcm) ||
                    (aValue.mId.mId == EMPTY_ID || (el.mId.mId == aValue.mId.mId)) ||
                    (aValue.mDomainId.mId == EMPTY_ID || (el.mDomainId.mId == aValue.mDomainId.mId)) ||
                    (aValue.mName.empty() || (aValue.mName == el.mName)) ||
                    (aValue.mXpan == 0 || aValue.mXpan == el.mXpan) || (aValue.mPan == 0 || (aValue.mPan == el.mPan)) ||
                    (aValue.mMlp.empty() || CaseInsensitiveEqual(aValue.mMlp, el.mMlp)) ||
                    (aValue.mChannel == 0 || (aValue.mChannel == el.mChannel));

        return aRet;
    };

    return LookupPred<Network>(pred, aRet, JSON_NWK);
}